

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binary-reader.cc
# Opt level: O1

Result __thiscall
wabt::anon_unknown_26::BinaryReader::ReadBytes
          (BinaryReader *this,void **out_data,Address *out_data_size,char *desc)

{
  Offset OVar1;
  Result RVar2;
  Enum EVar3;
  ulong uVar4;
  uint32_t data_size;
  uint32_t local_3c;
  Address *local_38;
  
  local_3c = 0;
  RVar2 = ReadU32Leb128(this,&local_3c,"data size");
  EVar3 = Error;
  if (RVar2.enum_ != Error) {
    OVar1 = (this->state_).offset;
    uVar4 = local_3c + OVar1;
    if (this->read_end_ < uVar4) {
      local_38 = out_data_size;
      PrintError(this,"unable to read data: %s",desc);
    }
    else {
      *out_data = (this->state_).data + OVar1;
      (this->state_).offset = uVar4;
      *out_data_size = (ulong)local_3c;
      EVar3 = Ok;
    }
  }
  return (Result)EVar3;
}

Assistant:

Result BinaryReader::ReadBytes(const void** out_data,
                               Address* out_data_size,
                               const char* desc) {
  uint32_t data_size = 0;
  CHECK_RESULT(ReadU32Leb128(&data_size, "data size"));
  CHECK_RESULT(ReadBytesWithSize(out_data, data_size, desc));
  *out_data_size = data_size;
  return Result::Ok;
}